

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dependency.cpp
# Opt level: O0

void __thiscall Dependency::copyYourself(Dependency *this)

{
  int iVar1;
  ostream *poVar2;
  string *in_stack_00000108;
  string command;
  Dependency *in_stack_fffffffffffffe78;
  string *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  string local_160 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb8;
  string local_140 [8];
  Dependency *in_stack_fffffffffffffec8;
  string local_120 [39];
  allocator local_f9;
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [48];
  string local_48 [32];
  string local_28 [40];
  
  getOriginalPath_abi_cxx11_(in_stack_fffffffffffffe78);
  getInstallPath_abi_cxx11_(in_stack_fffffffffffffec8);
  copyFile((string *)command._0_8_,in_stack_00000108);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,"install_name_tool -id \"",&local_f9);
  getInnerPath_abi_cxx11_(in_stack_fffffffffffffec8);
  std::operator+(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                 (char *)in_stack_fffffffffffffe80);
  getInstallPath_abi_cxx11_(in_stack_fffffffffffffec8);
  std::operator+(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                 (char *)in_stack_fffffffffffffe80);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_140);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string(local_d8);
  std::__cxx11::string::~string(local_120);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  iVar1 = systemp(in_stack_fffffffffffffe80);
  if (iVar1 != 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "\n\nError : An error occured while trying to change identity of library "
                            );
    getInstallPath_abi_cxx11_(in_stack_fffffffffffffec8);
    poVar2 = std::operator<<(poVar2,local_160);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_160);
    exit(1);
  }
  std::__cxx11::string::~string(local_78);
  return;
}

Assistant:

void Dependency::copyYourself()
{
    copyFile(getOriginalPath(), getInstallPath());
    
    // Fix the lib's inner name
    std::string command = std::string("install_name_tool -id \"") + getInnerPath() + "\" \"" + getInstallPath() + "\"";
    if( systemp( command ) != 0 )
    {
        std::cerr << "\n\nError : An error occured while trying to change identity of library " << getInstallPath() << std::endl;
        exit(1);
    }
}